

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O2

void __thiscall
QConcatenateTablesProxyModel::addSourceModel
          (QConcatenateTablesProxyModel *this,QAbstractItemModel *sourceModel)

{
  QConcatenateTablesProxyModelPrivate *this_00;
  int iVar1;
  ConnectionType type;
  long in_FS_OFFSET;
  pair<const_int_&,_const_QByteArray_&> pVar2;
  QHash<int,_QByteArray> newRoleNames;
  QHash<int,_QByteArray> local_e0;
  iterator<QHashPrivate::Node<int,_QByteArray>_> local_d8;
  QAbstractItemModel *local_c8;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  Object local_40;
  
  local_40.super_QObject.d_ptr.d = *(QObjectData **)(in_FS_OFFSET + 0x28);
  this_00 = *(QConcatenateTablesProxyModelPrivate **)(this + 8);
  local_c0._0_8_ = (_func_int **)0xffffffffffffffff;
  local_c0._8_8_ = (QObjectData *)0x0;
  auStack_b0._0_8_ = (QAbstractItemModel *)0x0;
  local_c8 = sourceModel;
  iVar1 = (*(sourceModel->super_QObject)._vptr_QObject[0xf])(sourceModel);
  if (0 < iVar1) {
    local_c0._0_8_ = (_func_int **)0xffffffffffffffff;
    local_c0._8_8_ = (QObjectData *)0x0;
    auStack_b0._0_8_ = (QAbstractItemModel *)0x0;
    QAbstractItemModel::beginInsertRows
              ((QAbstractItemModel *)this,(QModelIndex *)local_c0,this_00->m_rowCount,
               iVar1 + this_00->m_rowCount + -1);
  }
  this_00->m_rowCount = this_00->m_rowCount + iVar1;
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x411d1c);
  type = (ConnectionType)this_00;
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&)>
            ((Object *)local_c0,(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::dataChanged,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x411e00);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            ((Object *)(local_c0 + 8),(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::rowsInserted,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x411e54);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            ((Object *)auStack_b0,(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::rowsRemoved,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x411e9e);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            ((Object *)(auStack_b0 + 8),(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::rowsAboutToBeInserted,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x411f24);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            ((Object *)local_a0,(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::rowsAboutToBeRemoved,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x411faa);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int,QModelIndex_const&,int)>
            ((Object *)(local_a0 + 8),(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::rowsMoved,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x411fe8);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int,QModelIndex_const&,int)>
            ((Object *)local_90,(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::rowsAboutToBeMoved,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x412076);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            ((Object *)(local_90 + 8),(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::columnsInserted,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x4120c0);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            ((Object *)local_80,(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::columnsRemoved,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x41210a);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            ((Object *)(local_80 + 8),(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::columnsAboutToBeInserted,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x4121e2);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int)>
            ((Object *)local_70,(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::columnsAboutToBeRemoved,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x4122c2);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int,QModelIndex_const&,int)>
            ((Object *)(local_70 + 8),(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::columnsMoved,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x41235e);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)(QModelIndex_const&,int,int,QModelIndex_const&,int)>
            ((Object *)local_60,(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::columnsAboutToBeMoved,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x4123fa);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),void(QConcatenateTablesProxyModelPrivate::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>
            ((Object *)(local_60 + 8),(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::layoutAboutToBeChanged,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x4125c0);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),void(QConcatenateTablesProxyModelPrivate::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>
            ((Object *)local_50,(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::layoutChanged,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x412762);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)()>
            ((Object *)(local_50 + 8),(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::modelAboutToBeReset,0,type);
  local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)ZEXT816(0x412770);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QConcatenateTablesProxyModelPrivate::*)()>
            (&local_40,(offset_in_QAbstractItemModel_to_subr)sourceModel,
             (Object *)QAbstractItemModel::modelReset,0,type);
  QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::
  emplaceBack<QAbstractItemModel*&,std::array<QMetaObject::Connection,17ul>>
            (&this_00->m_models,&local_c8,(array<QMetaObject::Connection,_17UL> *)local_c0);
  std::array<QMetaObject::Connection,_17UL>::~array
            ((array<QMetaObject::Connection,_17UL> *)local_c0);
  if ((this_00->field_0x104 & 1) == 0) {
    local_e0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (*(local_c8->super_QObject)._vptr_QObject[0x2c])(&local_e0);
    local_d8 = (iterator<QHashPrivate::Node<int,_QByteArray>_>)
               QHash<int,_QByteArray>::begin(&local_e0);
    while ((local_d8.d != (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)0x0 ||
           (local_d8.bucket != 0))) {
      pVar2 = QKeyValueIterator<const_int_&,_const_QByteArray_&,_QHash<int,_QByteArray>::const_iterator>
              ::operator*((QKeyValueIterator<const_int_&,_const_QByteArray_&,_QHash<int,_QByteArray>::const_iterator>
                           *)&local_d8);
      QHash<int,QByteArray>::insert_or_assign<QByteArray_const&>
                ((pair<QKeyValueIterator<const_int_&,_QByteArray_&,_QHash<int,_QByteArray>::iterator>,_bool>
                  *)local_c0,(QHash<int,QByteArray> *)&this_00->m_roleNames,pVar2.first,pVar2.second
                );
      QHashPrivate::iterator<QHashPrivate::Node<int,_QByteArray>_>::operator++(&local_d8);
    }
    QHash<int,_QByteArray>::~QHash(&local_e0);
  }
  if (0 < iVar1) {
    QAbstractItemModel::endInsertRows((QAbstractItemModel *)this);
  }
  QConcatenateTablesProxyModelPrivate::updateColumnCount(this_00);
  if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_40.super_QObject.d_ptr.d) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QConcatenateTablesProxyModel::addSourceModel(QAbstractItemModel *sourceModel)
{
    Q_D(QConcatenateTablesProxyModel);
    Q_ASSERT(sourceModel);
    Q_ASSERT(!d->containsSourceModel(sourceModel));

    const int newRows = sourceModel->rowCount();
    if (newRows > 0)
        beginInsertRows(QModelIndex(), d->m_rowCount, d->m_rowCount + newRows - 1);
    d->m_rowCount += newRows;
    d->m_models.emplace_back(sourceModel, std::array{
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::dataChanged,
                                d, &QConcatenateTablesProxyModelPrivate::slotDataChanged),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsInserted,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsInserted),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsRemoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsRemoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsAboutToBeInserted,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeInserted),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsAboutToBeRemoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeRemoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsMoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsMoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsAboutToBeMoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeMoved),

        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsInserted,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsInserted),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsRemoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsRemoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsAboutToBeInserted,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeInserted),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsAboutToBeRemoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeRemoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsMoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsMoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsAboutToBeMoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeMoved),

        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::layoutAboutToBeChanged,
                                d, &QConcatenateTablesProxyModelPrivate::slotSourceLayoutAboutToBeChanged),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::layoutChanged,
                                d, &QConcatenateTablesProxyModelPrivate::slotSourceLayoutChanged),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::modelAboutToBeReset,
                                d, &QConcatenateTablesProxyModelPrivate::slotModelAboutToBeReset),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::modelReset,
                                d, &QConcatenateTablesProxyModelPrivate::slotModelReset),
    });
    if (!d->m_roleNamesDirty) {
        // do update immediately, since append() is a simple update:
        const auto newRoleNames = sourceModel->roleNames();
        for (const auto &[k, v] : newRoleNames.asKeyValueRange())
            d->m_roleNames.insert_or_assign(k, v);
    }
    if (newRows > 0)
        endInsertRows();

    d->updateColumnCount();
}